

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O2

char * COST_SENSITIVE::bufcache_label(label *ld,char *c)

{
  wclass *pwVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint uVar4;
  
  *(long *)c = (long)(ld->costs)._end - (long)(ld->costs)._begin >> 4;
  pcVar3 = c + 8;
  uVar4 = 0;
  while( true ) {
    pwVar1 = (ld->costs)._begin;
    if ((ulong)((long)(ld->costs)._end - (long)pwVar1 >> 4) <= (ulong)uVar4) break;
    pwVar1 = pwVar1 + uVar4;
    uVar2 = *(undefined8 *)&pwVar1->partial_prediction;
    *(undefined8 *)pcVar3 = *(undefined8 *)pwVar1;
    *(undefined8 *)(pcVar3 + 8) = uVar2;
    pcVar3 = pcVar3 + 0x10;
    uVar4 = uVar4 + 1;
  }
  return pcVar3;
}

Assistant:

char* bufcache_label(label* ld, char* c)
{
  *(size_t*)c = ld->costs.size();
  c += sizeof(size_t);
  for (unsigned int i = 0; i < ld->costs.size(); i++)
  {
    *(wclass*)c = ld->costs[i];
    c += sizeof(wclass);
  }
  return c;
}